

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importParser.h
# Opt level: O2

void __thiscall sqimportparser::ImportParser::skipSpaceAndComments(ImportParser *this)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  byte *pbVar6;
  pair<const_char_*,_const_char_*> local_40;
  
  bVar4 = true;
  pbVar6 = (byte *)0x0;
  bVar3 = false;
LAB_0011cf8f:
  if (!bVar4) {
    return;
  }
  do {
    pbVar2 = (byte *)this->p;
    bVar1 = *pbVar2;
    uVar5 = (ulong)bVar1;
    if (uVar5 < 0x21) {
      if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
        if (uVar5 != 0) goto LAB_0011cffc;
        bVar4 = false;
        if (bVar3) {
          error(this,"unexpected end of file inside comment");
LAB_0011d044:
          bVar4 = false;
        }
        goto LAB_0011cf8f;
      }
LAB_0011cfab:
      if (bVar3) {
        if ((bVar1 == 0x2a) && (pbVar2[1] == 0x2f)) {
          this->p = (char *)(pbVar2 + 1);
          if ((vector<std::pair<char_const*,char_const*>,std::allocator<std::pair<char_const*,char_const*>>>
               *)this->keepRanges !=
              (vector<std::pair<char_const*,char_const*>,std::allocator<std::pair<char_const*,char_const*>>>
               *)0x0) {
            local_40.second = (char *)(pbVar2 + 2);
            local_40.first = (char *)pbVar6;
            std::
            vector<std::pair<char_const*,char_const*>,std::allocator<std::pair<char_const*,char_const*>>>
            ::emplace_back<std::pair<char_const*,char_const*>>
                      ((vector<std::pair<char_const*,char_const*>,std::allocator<std::pair<char_const*,char_const*>>>
                        *)this->keepRanges,&local_40);
          }
          bVar3 = false;
        }
      }
      else if ((bVar1 == 0x2f) && (pbVar2[1] == 0x2a)) goto LAB_0011d00e;
    }
    else {
LAB_0011cffc:
      if (bVar3) goto LAB_0011cfab;
      if (bVar1 != 0x2f) goto LAB_0011d044;
      if (pbVar2[1] != 0x2a) break;
LAB_0011d00e:
      this->p = (char *)(pbVar2 + 1);
      bVar3 = true;
      pbVar6 = pbVar2;
    }
    nextChar(this);
  } while( true );
  bVar4 = false;
  if (pbVar2[1] == 0x2f) {
    do {
      if (((byte)*this->p < 0xe) && ((0x2401U >> ((byte)*this->p & 0x1f) & 1) != 0)) break;
      bVar4 = nextChar(this);
    } while (!bVar4);
    bVar4 = true;
    if ((vector<std::pair<char_const*,char_const*>,std::allocator<std::pair<char_const*,char_const*>>>
         *)this->keepRanges !=
        (vector<std::pair<char_const*,char_const*>,std::allocator<std::pair<char_const*,char_const*>>>
         *)0x0) {
      local_40.second = this->p + 1;
      local_40.first = (char *)pbVar2;
      std::
      vector<std::pair<char_const*,char_const*>,std::allocator<std::pair<char_const*,char_const*>>>
      ::emplace_back<std::pair<char_const*,char_const*>>
                ((vector<std::pair<char_const*,char_const*>,std::allocator<std::pair<char_const*,char_const*>>>
                  *)this->keepRanges,&local_40);
      bVar4 = true;
    }
  }
  goto LAB_0011cf8f;
}

Assistant:

void skipSpaceAndComments()
  {
    bool repeat = true;
    bool insideComment = false;
    const char * commentFrom = nullptr;
    while (repeat)
    {
      repeat = false;
      while (*p && (*p == ' ' || *p == '\t' || *p == '\r' || *p == '\n' || insideComment || (*p == '/' && p[1] == '*')))
      {
        if (!insideComment && *p == '/' && p[1] == '*')
        {
          insideComment = true;
          commentFrom = p;
          p++;
        }
        else if (insideComment && *p == '*' && p[1] == '/')
        {
          insideComment = false;
          p++;

          if (keepRanges)
            keepRanges->push_back(MODULE_PARSE_STL::make_pair(commentFrom, p + 1));
        }
        nextChar();
      }

      if (insideComment && *p == 0)
        error("unexpected end of file inside comment");

      if (!insideComment && *p == '/' && p[1] == '/')
      {
        const char * from = p;
        repeat = true;
        while (*p && *p != '\r' && *p != '\n')
          if (nextChar())
            break;

        if (keepRanges)
          keepRanges->push_back(MODULE_PARSE_STL::make_pair(from, p + 1));
      }
    }
  }